

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::createInstance
          (BeagleCPUImpl<double,_1,_0> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenDecompositionCount,
          int matrixCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags)

{
  size_t __size;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  EigenDecompositionSquare<double,_1> *this_00;
  double **ppdVar12;
  double *pdVar13;
  int **ppiVar14;
  double *pdVar15;
  void *pvVar16;
  int *piVar17;
  undefined8 *puVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 in_ZMM5 [64];
  double *local_90;
  size_t local_88;
  double ***local_80;
  undefined1 local_78 [64];
  
  this->realtypeMin = 2.2250738585072014e-308;
  this->scalingExponentThreshold = 200;
  *(int *)&(this->super_BeagleImpl).field_0xc = partialsBufferCount + compactBufferCount;
  this->kTipCount = tipCount;
  this->kStateCount = stateCount;
  this->kPatternCount = patternCount;
  this->kPartitionCount = 1;
  this->kMaxPartitionCount = 1;
  this->kPartitionsInitialised = false;
  this->kPatternsReordered = false;
  this->kInternalPartialsBufferCount = (partialsBufferCount + compactBufferCount) - tipCount;
  this->kTransPaddedStateCount = stateCount + 1;
  this->kPartialsPaddedStateCount = stateCount;
  iVar9 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5c])();
  iVar21 = this->kStateCount;
  iVar20 = this->kPatternCount % iVar9;
  iVar9 = iVar9 - iVar20;
  if (iVar20 == 0) {
    iVar9 = 0;
  }
  uVar24 = requirementFlags | preferenceFlags;
  iVar20 = this->kPatternCount + iVar9;
  this->kPaddedPatternCount = iVar20;
  this->kExtraPatterns = iVar9;
  this->kMatrixCount = matrixCount;
  this->kEigenDecompCount = eigenDecompositionCount;
  this->kCategoryCount = categoryCount;
  this->kScaleBufferCount = scaleBufferCount;
  this->kMatrixSize = (iVar21 + 1) * iVar21;
  this->kFlags = 0;
  uVar10 = (uint)uVar24;
  if ((char)uVar24 < '\0') {
    this->kFlags = 0x480;
    this->kScaleBufferCount = this->kInternalPartialsBufferCount;
    lVar11 = 0x480;
  }
  else if ((uVar10 >> 8 & 1) == 0) {
    if ((uVar10 >> 0x19 & 1) == 0) {
      if ((uVar10 >> 10 & 1) == 0) {
        lVar11 = 0x240;
        this->kFlags = 0x240;
      }
      else {
        this->kFlags = 0x440;
        lVar11 = 0x440;
      }
    }
    else {
      this->kFlags = 0x2000200;
      lVar11 = 0x2000200;
    }
  }
  else {
    this->kFlags = 0x500;
    this->kScaleBufferCount = this->kInternalPartialsBufferCount + 1;
    lVar11 = 0x500;
  }
  uVar22 = 0x40000000;
  if ((uVar10 >> 0x1e & 1) == 0) {
    uVar22 = 0x4000;
  }
  lVar11 = (ulong)(((uVar10 & 0x20) >> 5) << 4) + lVar11 + 0x100010 +
           (uVar22 | (uint)(uVar24 >> 1) & 0x100000);
  this->kFlags = lVar11;
  if ((uVar24 & 0x20) == 0) {
    this_00 = (EigenDecompositionSquare<double,_1> *)operator_new(0x48);
    EigenDecompositionCube<double,_1>::EigenDecompositionCube
              ((EigenDecompositionCube<double,_1> *)this_00,eigenDecompositionCount,iVar21,
               categoryCount,lVar11);
  }
  else {
    this_00 = (EigenDecompositionSquare<double,_1> *)operator_new(0x58);
    EigenDecompositionSquare<double,_1>::EigenDecompositionSquare
              (this_00,eigenDecompositionCount,iVar21,categoryCount,lVar11);
  }
  this->gEigenDecomposition = &this_00->super_EigenDecomposition<double,_1>;
  sVar26 = (size_t)this->kEigenDecompCount;
  ppdVar12 = (double **)calloc(8,sVar26);
  this->gCategoryRates = ppdVar12;
  if (ppdVar12 != (double **)0x0) {
    pdVar13 = (double *)malloc((long)this->kPatternCount << 3);
    this->gPatternWeights = pdVar13;
    if (pdVar13 != (double *)0x0) {
      this->kPartialsSize =
           this->kPartialsPaddedStateCount * this->kPaddedPatternCount * this->kCategoryCount;
      iVar21 = *(int *)&(this->super_BeagleImpl).field_0xc;
      __size = (long)iVar21 * 8;
      ppdVar12 = (double **)malloc(__size);
      this->gPartials = ppdVar12;
      if (ppdVar12 != (double **)0x0) {
        ppdVar12 = (double **)calloc(8,sVar26);
        this->gStateFrequencies = ppdVar12;
        if (ppdVar12 != (double **)0x0) {
          ppdVar12 = (double **)calloc(8,sVar26);
          this->gCategoryWeights = ppdVar12;
          if (ppdVar12 != (double **)0x0) {
            ppiVar14 = (int **)malloc(__size);
            this->gTipStates = ppiVar14;
            if (ppiVar14 != (int **)0x0) {
              if (0 < iVar21) {
                lVar11 = 0;
                do {
                  this->gPartials[lVar11] = (double *)0x0;
                  this->gTipStates[lVar11] = (int *)0x0;
                  lVar11 = lVar11 + 1;
                } while (iVar21 != lVar11);
              }
              lVar11 = (long)this->kTipCount;
              if (this->kTipCount < iVar21) {
                do {
                  local_90 = (double *)0x0;
                  posix_memalign(&local_90,0x20,(long)this->kPartialsSize << 3);
                  this->gPartials[lVar11] = local_90;
                  if (this->gPartials[lVar11] == (double *)0x0) goto LAB_001205bc;
                  lVar11 = lVar11 + 1;
                } while (lVar11 < *(int *)&(this->super_BeagleImpl).field_0xc);
              }
              this->gScaleBuffers = (double **)0x0;
              this->gAutoScaleBuffers = (short **)0x0;
              iVar21 = this->kScaleBufferCount;
              lVar25 = (long)iVar21;
              lVar11 = this->kFlags;
              ppdVar12 = (double **)malloc(lVar25 * 8);
              auVar47 = in_ZMM5._0_16_;
              if ((char)lVar11 < '\0') {
                this->gAutoScaleBuffers = (short **)ppdVar12;
                if (ppdVar12 == (double **)0x0) goto LAB_001205bc;
                if (0 < iVar21) {
                  lVar11 = 0;
                  do {
                    pdVar13 = (double *)malloc((long)iVar20 * 2);
                    auVar47 = in_ZMM5._0_16_;
                    ppdVar12[lVar11] = pdVar13;
                    ppdVar12 = (double **)this->gAutoScaleBuffers;
                    if (ppdVar12[lVar11] == (double *)0x0) goto LAB_001205bc;
                    lVar11 = lVar11 + 1;
                  } while (lVar25 != lVar11);
                }
                piVar17 = (int *)malloc((long)this->kInternalPartialsBufferCount << 2);
                this->gActiveScalingFactors = piVar17;
                ppdVar12 = (double **)malloc(8);
                this->gScaleBuffers = ppdVar12;
                pdVar13 = (double *)malloc((long)iVar20 << 3);
                *ppdVar12 = pdVar13;
              }
              else {
                local_80 = &this->gScaleBuffers;
                *local_80 = ppdVar12;
                if (ppdVar12 == (double **)0x0) goto LAB_001205bc;
                if (0 < iVar21) {
                  local_88 = (long)iVar20 << 3;
                  lVar23 = 0;
                  auVar28 = vpbroadcastq_avx512f();
                  local_78 = vmovdqu64_avx512f(auVar28);
                  do {
                    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                    pdVar13 = (double *)malloc(local_88);
                    auVar47 = in_ZMM5._0_16_;
                    ppdVar12[lVar23] = pdVar13;
                    ppdVar12 = *local_80;
                    pdVar13 = ppdVar12[lVar23];
                    if (pdVar13 == (double *)0x0) goto LAB_001205bc;
                    auVar28 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
                    auVar29 = vmovdqu64_avx512f(local_78);
                    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    if (0 < iVar20 && ((uint)lVar11 >> 0x19 & 1) != 0) {
                      uVar24 = 0;
                      do {
                        auVar31 = vpbroadcastq_avx512f();
                        auVar31 = vporq_avx512f(auVar31,auVar30);
                        uVar22 = vpcmpuq_avx512f(auVar31,auVar29,2);
                        pdVar15 = pdVar13 + uVar24;
                        bVar2 = (bool)((byte)uVar22 & 1);
                        bVar3 = (bool)((byte)(uVar22 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar22 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar22 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar22 >> 6) & 1);
                        *pdVar15 = (double)((ulong)bVar2 * auVar28._0_8_ |
                                           (ulong)!bVar2 * (long)*pdVar15);
                        pdVar15[1] = (double)((ulong)bVar3 * auVar28._8_8_ |
                                             (ulong)!bVar3 * (long)pdVar15[1]);
                        pdVar15[2] = (double)((ulong)bVar4 * auVar28._16_8_ |
                                             (ulong)!bVar4 * (long)pdVar15[2]);
                        pdVar15[3] = (double)((ulong)bVar5 * auVar28._24_8_ |
                                             (ulong)!bVar5 * (long)pdVar15[3]);
                        pdVar15[4] = (double)((ulong)bVar6 * auVar28._32_8_ |
                                             (ulong)!bVar6 * (long)pdVar15[4]);
                        pdVar15[5] = (double)((ulong)bVar7 * auVar28._40_8_ |
                                             (ulong)!bVar7 * (long)pdVar15[5]);
                        pdVar15[6] = (double)((ulong)bVar8 * auVar28._48_8_ |
                                             (ulong)!bVar8 * (long)pdVar15[6]);
                        pdVar15[7] = (double)((uVar22 >> 7) * auVar28._56_8_ |
                                             (ulong)!SUB81(uVar22 >> 7,0) * (long)pdVar15[7]);
                        uVar24 = uVar24 + 8;
                      } while ((iVar20 + 7U & 0xfffffff8) != uVar24);
                    }
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != lVar25);
                }
              }
              iVar21 = this->kMatrixCount;
              auVar28 = ZEXT1664(auVar47);
              ppdVar12 = (double **)malloc((long)iVar21 * 8);
              auVar47 = auVar28._0_16_;
              this->gTransitionMatrices = ppdVar12;
              if (ppdVar12 != (double **)0x0) {
                if (0 < iVar21) {
                  lVar11 = 0;
                  do {
                    local_90 = (double *)0x0;
                    posix_memalign(&local_90,0x20,
                                   (long)this->kCategoryCount * (long)this->kMatrixSize * 8);
                    auVar47 = auVar28._0_16_;
                    this->gTransitionMatrices[lVar11] = local_90;
                    if (this->gTransitionMatrices[lVar11] == (double *)0x0) goto LAB_001205bc;
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < this->kMatrixCount);
                }
                local_90 = (double *)0x0;
                posix_memalign(&local_90,0x20,
                               (long)this->kStateCount * (long)this->kPatternCount * 8);
                this->integrationTmp = local_90;
                sVar26 = (long)this->kStateCount * (long)this->kPatternCount * 8;
                pdVar13 = (double *)malloc(sVar26);
                this->firstDerivTmp = pdVar13;
                pdVar13 = (double *)malloc(sVar26);
                this->secondDerivTmp = pdVar13;
                local_90 = (double *)0x0;
                posix_memalign(&local_90,0x20,(long)this->kPaddedPatternCount << 3);
                this->grandDenominatorDerivTmp = local_90;
                local_90 = (double *)0x0;
                posix_memalign(&local_90,0x20,(long)this->kPaddedPatternCount << 3);
                this->grandNumeratorDerivTmp = local_90;
                this->crossProductNumeratorTmp = (double *)0x0;
                sVar26 = (long)this->kStateCount * (long)this->kPatternCount * 8;
                pdVar13 = (double *)malloc(sVar26);
                this->outLogLikelihoodsTmp = pdVar13;
                pdVar13 = (double *)malloc(sVar26);
                this->outFirstDerivativesTmp = pdVar13;
                pdVar13 = (double *)malloc(sVar26);
                this->outSecondDerivativesTmp = pdVar13;
                iVar21 = this->kPaddedPatternCount;
                sVar26 = (long)iVar21 * 8;
                pdVar13 = (double *)malloc(sVar26);
                this->zeros = pdVar13;
                pdVar15 = (double *)malloc(sVar26);
                this->ones = pdVar15;
                if (0 < (long)iVar21) {
                  uVar24 = 0;
                  memset(pdVar13,0,sVar26);
                  auVar28 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
                  auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar30 = vpbroadcastq_avx512f();
                  do {
                    auVar31 = vpbroadcastq_avx512f();
                    auVar31 = vporq_avx512f(auVar31,auVar29);
                    uVar22 = vpcmpuq_avx512f(auVar31,auVar30,2);
                    pdVar13 = pdVar15 + uVar24;
                    bVar2 = (bool)((byte)uVar22 & 1);
                    bVar3 = (bool)((byte)(uVar22 >> 1) & 1);
                    bVar4 = (bool)((byte)(uVar22 >> 2) & 1);
                    bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
                    bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
                    bVar7 = (bool)((byte)(uVar22 >> 5) & 1);
                    bVar8 = (bool)((byte)(uVar22 >> 6) & 1);
                    *pdVar13 = (double)((ulong)bVar2 * auVar28._0_8_ |
                                       (ulong)!bVar2 * (long)*pdVar13);
                    pdVar13[1] = (double)((ulong)bVar3 * auVar28._8_8_ |
                                         (ulong)!bVar3 * (long)pdVar13[1]);
                    pdVar13[2] = (double)((ulong)bVar4 * auVar28._16_8_ |
                                         (ulong)!bVar4 * (long)pdVar13[2]);
                    pdVar13[3] = (double)((ulong)bVar5 * auVar28._24_8_ |
                                         (ulong)!bVar5 * (long)pdVar13[3]);
                    pdVar13[4] = (double)((ulong)bVar6 * auVar28._32_8_ |
                                         (ulong)!bVar6 * (long)pdVar13[4]);
                    pdVar13[5] = (double)((ulong)bVar7 * auVar28._40_8_ |
                                         (ulong)!bVar7 * (long)pdVar13[5]);
                    pdVar13[6] = (double)((ulong)bVar8 * auVar28._48_8_ |
                                         (ulong)!bVar8 * (long)pdVar13[6]);
                    pdVar13[7] = (double)((uVar22 >> 7) * auVar28._56_8_ |
                                         (ulong)!SUB81(uVar22 >> 7,0) * (long)pdVar13[7]);
                    uVar24 = uVar24 + 8;
                  } while ((iVar21 + 7U & 0xfffffff8) != uVar24);
                }
                this->kThreadingEnabled = false;
                this->kAutoPartitioningEnabled = false;
                if ((this->kFlags & 0x40000000) != 0) {
                  auVar28 = ZEXT1664(auVar47);
                  uVar10 = std::thread::hardware_concurrency();
                  if (this->kStateCount < 5) {
                    this->kMinPatternCount = 0x100;
                    if ((int)uVar10 < 0x10) {
                      this->kMinPatternCount = 0x300;
                      uVar19 = 0x300;
                    }
                    else {
                      uVar19 = 0x100;
                      if (this->kPatternCount < 0x40000) {
                        uVar10 = 0x10;
                      }
                    }
                  }
                  else {
                    uVar19 = 2;
                    this->kMinPatternCount = 2;
                  }
                  uVar1 = this->kPatternCount;
                  if (2 < (int)uVar10 && (int)uVar19 <= (int)uVar1) {
                    uVar27 = 0;
                    uVar24 = (ulong)uVar1 / (ulong)(uVar19 >> 1);
                    uVar22 = (ulong)(uVar10 >> 1);
                    if ((uint)uVar24 < uVar10 >> 1) {
                      uVar22 = uVar24;
                    }
                    pvVar16 = malloc((ulong)uVar1 * 4);
                    auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar31 = vpbroadcastq_avx512f(ZEXT816(0x10));
                    auVar32 = vpbroadcastd_avx512f();
                    auVar33 = vpbroadcastq_avx512f();
                    auVar34 = vpbroadcastd_avx512f();
                    do {
                      uVar24 = vpcmpuq_avx512f(auVar30,auVar33,2);
                      iVar21 = (int)(uVar1 / uVar22);
                      iVar9 = (int)uVar27;
                      if ((uVar24 & 1) != 0) {
                        auVar28 = ZEXT464((uint)((long)((ulong)(uint)(iVar9 >> 0x1f) << 0x20 |
                                                       uVar27 & 0xffffffff) / (long)iVar21));
                      }
                      if ((uVar24 & 2) != 0) {
                        auVar47 = vpinsrd_avx(auVar28._0_16_,(iVar9 + 1) / iVar21,1);
                        auVar28 = vinserti32x4_avx512f(auVar28,auVar47,0);
                      }
                      if ((uVar24 & 4) != 0) {
                        auVar47 = vpinsrd_avx(auVar28._0_16_,(iVar9 + 2) / iVar21,2);
                        auVar28 = vinserti32x4_avx512f(auVar28,auVar47,0);
                      }
                      if ((uVar24 & 8) != 0) {
                        auVar47 = vpinsrd_avx(auVar28._0_16_,(iVar9 + 3) / iVar21,3);
                        auVar28 = vinserti32x4_avx512f(auVar28,auVar47,0);
                      }
                      auVar46 = auVar28;
                      if ((uVar24 & 0x10) != 0) {
                        auVar35 = vpbroadcastd_avx512f();
                        auVar46._0_16_ = auVar28._0_16_;
                        auVar46._16_4_ = auVar35._16_4_;
                        auVar46._20_4_ = auVar28._20_4_;
                        auVar46._24_4_ = auVar28._24_4_;
                        auVar46._28_4_ = auVar28._28_4_;
                        auVar46._32_4_ = auVar28._32_4_;
                        auVar46._36_4_ = auVar28._36_4_;
                        auVar46._40_4_ = auVar28._40_4_;
                        auVar46._44_4_ = auVar28._44_4_;
                        auVar46._48_4_ = auVar28._48_4_;
                        auVar46._52_4_ = auVar28._52_4_;
                        auVar46._56_4_ = auVar28._56_4_;
                        auVar46._60_4_ = auVar28._60_4_;
                      }
                      auVar35 = auVar46;
                      if ((uVar24 & 0x20) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar35._0_20_ = auVar46._0_20_;
                        auVar35._20_4_ = auVar28._20_4_;
                        auVar35._24_4_ = auVar46._24_4_;
                        auVar35._28_4_ = auVar46._28_4_;
                        auVar35._32_4_ = auVar46._32_4_;
                        auVar35._36_4_ = auVar46._36_4_;
                        auVar35._40_4_ = auVar46._40_4_;
                        auVar35._44_4_ = auVar46._44_4_;
                        auVar35._48_4_ = auVar46._48_4_;
                        auVar35._52_4_ = auVar46._52_4_;
                        auVar35._56_4_ = auVar46._56_4_;
                        auVar35._60_4_ = auVar46._60_4_;
                      }
                      auVar36 = auVar35;
                      if ((uVar24 & 0x40) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar36._0_24_ = auVar35._0_24_;
                        auVar36._24_4_ = auVar28._24_4_;
                        auVar36._28_4_ = auVar35._28_4_;
                        auVar36._32_4_ = auVar35._32_4_;
                        auVar36._36_4_ = auVar35._36_4_;
                        auVar36._40_4_ = auVar35._40_4_;
                        auVar36._44_4_ = auVar35._44_4_;
                        auVar36._48_4_ = auVar35._48_4_;
                        auVar36._52_4_ = auVar35._52_4_;
                        auVar36._56_4_ = auVar35._56_4_;
                        auVar36._60_4_ = auVar35._60_4_;
                      }
                      auVar37 = auVar36;
                      if ((uVar24 & 0x80) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar37._0_28_ = auVar36._0_28_;
                        auVar37._28_4_ = auVar28._28_4_;
                        auVar37._32_4_ = auVar36._32_4_;
                        auVar37._36_4_ = auVar36._36_4_;
                        auVar37._40_4_ = auVar36._40_4_;
                        auVar37._44_4_ = auVar36._44_4_;
                        auVar37._48_4_ = auVar36._48_4_;
                        auVar37._52_4_ = auVar36._52_4_;
                        auVar37._56_4_ = auVar36._56_4_;
                        auVar37._60_4_ = auVar36._60_4_;
                      }
                      uVar24 = vpcmpuq_avx512f(auVar29,auVar33,2);
                      auVar38 = auVar37;
                      if ((uVar24 & 1) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar38._0_32_ = auVar37._0_32_;
                        auVar38._32_4_ = auVar28._32_4_;
                        auVar38._36_4_ = auVar37._36_4_;
                        auVar38._40_4_ = auVar37._40_4_;
                        auVar38._44_4_ = auVar37._44_4_;
                        auVar38._48_4_ = auVar37._48_4_;
                        auVar38._52_4_ = auVar37._52_4_;
                        auVar38._56_4_ = auVar37._56_4_;
                        auVar38._60_4_ = auVar37._60_4_;
                      }
                      auVar39 = auVar38;
                      if ((uVar24 & 2) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar39._0_36_ = auVar38._0_36_;
                        auVar39._36_4_ = auVar28._36_4_;
                        auVar39._40_4_ = auVar38._40_4_;
                        auVar39._44_4_ = auVar38._44_4_;
                        auVar39._48_4_ = auVar38._48_4_;
                        auVar39._52_4_ = auVar38._52_4_;
                        auVar39._56_4_ = auVar38._56_4_;
                        auVar39._60_4_ = auVar38._60_4_;
                      }
                      auVar40 = auVar39;
                      if ((uVar24 & 4) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar40._0_40_ = auVar39._0_40_;
                        auVar40._40_4_ = auVar28._40_4_;
                        auVar40._44_4_ = auVar39._44_4_;
                        auVar40._48_4_ = auVar39._48_4_;
                        auVar40._52_4_ = auVar39._52_4_;
                        auVar40._56_4_ = auVar39._56_4_;
                        auVar40._60_4_ = auVar39._60_4_;
                      }
                      auVar41 = auVar40;
                      if ((uVar24 & 8) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar41._0_44_ = auVar40._0_44_;
                        auVar41._44_4_ = auVar28._44_4_;
                        auVar41._48_4_ = auVar40._48_4_;
                        auVar41._52_4_ = auVar40._52_4_;
                        auVar41._56_4_ = auVar40._56_4_;
                        auVar41._60_4_ = auVar40._60_4_;
                      }
                      auVar42 = auVar41;
                      if ((uVar24 & 0x10) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar42._0_48_ = auVar41._0_48_;
                        auVar42._48_4_ = auVar28._48_4_;
                        auVar42._52_4_ = auVar41._52_4_;
                        auVar42._56_4_ = auVar41._56_4_;
                        auVar42._60_4_ = auVar41._60_4_;
                      }
                      auVar43 = auVar42;
                      if ((uVar24 & 0x20) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar43._0_52_ = auVar42._0_52_;
                        auVar43._52_4_ = auVar28._52_4_;
                        auVar43._56_4_ = auVar42._56_4_;
                        auVar43._60_4_ = auVar42._60_4_;
                      }
                      auVar44 = auVar43;
                      if ((uVar24 & 0x40) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar44._0_56_ = auVar43._0_56_;
                        auVar44._56_4_ = auVar28._56_4_;
                        auVar44._60_4_ = auVar43._60_4_;
                      }
                      auVar45 = auVar44;
                      if ((uVar24 & 0x80) != 0) {
                        auVar28 = vpbroadcastd_avx512f();
                        auVar45._60_4_ = auVar28._60_4_;
                        auVar45._0_60_ = auVar44._0_60_;
                      }
                      uVar24 = vpcmpgtd_avx512f(auVar32,auVar45);
                      auVar30 = vpaddq_avx512f(auVar30,auVar31);
                      auVar29 = vpaddq_avx512f(auVar29,auVar31);
                      auVar46 = vpblendmd_avx512f(auVar34,auVar45);
                      bVar2 = (bool)((byte)uVar24 & 1);
                      auVar28._0_4_ = (uint)bVar2 * auVar46._0_4_ | (uint)!bVar2 * auVar45._0_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 1) & 1);
                      auVar28._4_4_ = (uint)bVar2 * auVar46._4_4_ | (uint)!bVar2 * auVar45._4_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 2) & 1);
                      auVar28._8_4_ = (uint)bVar2 * auVar46._8_4_ | (uint)!bVar2 * auVar45._8_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 3) & 1);
                      auVar28._12_4_ = (uint)bVar2 * auVar46._12_4_ | (uint)!bVar2 * auVar45._12_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 4) & 1);
                      auVar28._16_4_ = (uint)bVar2 * auVar46._16_4_ | (uint)!bVar2 * auVar45._16_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 5) & 1);
                      auVar28._20_4_ = (uint)bVar2 * auVar46._20_4_ | (uint)!bVar2 * auVar45._20_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 6) & 1);
                      auVar28._24_4_ = (uint)bVar2 * auVar46._24_4_ | (uint)!bVar2 * auVar45._24_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 7) & 1);
                      auVar28._28_4_ = (uint)bVar2 * auVar46._28_4_ | (uint)!bVar2 * auVar45._28_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 8) & 1);
                      auVar28._32_4_ = (uint)bVar2 * auVar46._32_4_ | (uint)!bVar2 * auVar45._32_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 9) & 1);
                      auVar28._36_4_ = (uint)bVar2 * auVar46._36_4_ | (uint)!bVar2 * auVar45._36_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 10) & 1);
                      auVar28._40_4_ = (uint)bVar2 * auVar46._40_4_ | (uint)!bVar2 * auVar45._40_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 0xb) & 1);
                      auVar28._44_4_ = (uint)bVar2 * auVar46._44_4_ | (uint)!bVar2 * auVar45._44_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 0xc) & 1);
                      auVar28._48_4_ = (uint)bVar2 * auVar46._48_4_ | (uint)!bVar2 * auVar45._48_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 0xd) & 1);
                      auVar28._52_4_ = (uint)bVar2 * auVar46._52_4_ | (uint)!bVar2 * auVar45._52_4_;
                      bVar2 = (bool)((byte)(uVar24 >> 0xe) & 1);
                      auVar28._56_4_ = (uint)bVar2 * auVar46._56_4_ | (uint)!bVar2 * auVar45._56_4_;
                      bVar2 = SUB81(uVar24 >> 0xf,0);
                      auVar28._60_4_ = (uint)bVar2 * auVar46._60_4_ | (uint)!bVar2 * auVar45._60_4_;
                      auVar46 = vmovdqu32_avx512f(auVar28);
                      *(undefined1 (*) [64])((long)pvVar16 + uVar27 * 4) = auVar46;
                      uVar27 = uVar27 + 0x10;
                    } while ((uVar1 + 0xf & 0xfffffff0) != uVar27);
                    (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,uVar22,pvVar16);
                    piVar17 = (int *)malloc((long)this->kPartitionCount *
                                            (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24
                                           );
                    this->gAutoPartitionOperations = piVar17;
                    if (this->kMinPatternCount * 4 <= this->kPatternCount) {
                      piVar17 = (int *)malloc(uVar22 * 4);
                      auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      auVar30 = vpmovsxbd_avx512f(_DAT_00141b90);
                      auVar31 = vpbroadcastd_avx512f(ZEXT416(0x10));
                      auVar32 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      this->gAutoPartitionIndices = piVar17;
                      auVar33 = vpbroadcastq_avx512f();
                      uVar24 = 0;
                      do {
                        vpcmpuq_avx512f(auVar29,auVar33,2);
                        vpcmpuq_avx512f(auVar28,auVar33,2);
                        auVar29 = vpaddq_avx512f(auVar29,auVar32);
                        auVar28 = vpaddq_avx512f(auVar28,auVar32);
                        auVar34 = vmovdqu32_avx512f(auVar30);
                        *(undefined1 (*) [64])(piVar17 + uVar24) = auVar34;
                        uVar24 = uVar24 + 0x10;
                        auVar30 = vpaddd_avx512f(auVar30,auVar31);
                      } while (((int)uVar22 + 0xfU & 0x7ffffff0) != uVar24);
                      pdVar13 = (double *)malloc(uVar22 << 3);
                      this->gAutoPartitionOutSumLogLikelihoods = pdVar13;
                      this->kAutoRootPartitioningEnabled = false;
                    }
                    this->kAutoPartitioningEnabled = false;
                  }
                }
                return 0;
              }
            }
          }
        }
      }
    }
  }
LAB_001205bc:
  puVar18 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar18 = __cxa_init_primary_exception;
  __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::createInstance(int tipCount,
                                  int partialsBufferCount,
                                  int compactBufferCount,
                                  int stateCount,
                                  int patternCount,
                                  int eigenDecompositionCount,
                                  int matrixCount,
                                  int categoryCount,
                                  int scaleBufferCount,
                                  int resourceNumber,
                                  int pluginResourceNumber,
                                  long preferenceFlags,
                                  long requirementFlags) {
    if (DEBUGGING_OUTPUT)
        std::cerr << "in BeagleCPUImpl::initialize\n" ;

    if (DOUBLE_PRECISION) {
        realtypeMin = DBL_MIN;
        scalingExponentThreshold = 200;
    } else {
        realtypeMin = FLT_MIN;
        scalingExponentThreshold = 20;
    }

    kBufferCount = partialsBufferCount + compactBufferCount;
    kTipCount = tipCount;
    assert(kBufferCount > kTipCount);
    kStateCount = stateCount;
    kPatternCount = patternCount;

    kPartitionCount = 1;
    kMaxPartitionCount = kPartitionCount;
    kPartitionsInitialised = false;
    kPatternsReordered = false;

    kInternalPartialsBufferCount = kBufferCount - kTipCount;

    kTransPaddedStateCount = kStateCount + T_PAD;
    kPartialsPaddedStateCount = kStateCount + P_PAD;

    // Handle possible padding of pattern sites for vectorization
    int modulus = getPaddedPatternsModulus();
    kPaddedPatternCount = kPatternCount;
    int remainder = kPatternCount % modulus;
    if (remainder != 0) {
        kPaddedPatternCount += modulus - remainder;
    }
    kExtraPatterns = kPaddedPatternCount - kPatternCount;

    kMatrixCount = matrixCount;
    kEigenDecompCount = eigenDecompositionCount;
    kCategoryCount = categoryCount;
    kScaleBufferCount = scaleBufferCount;

    kMatrixSize = (T_PAD + kStateCount) * kStateCount;

    int scaleBufferSize = kPaddedPatternCount;

    kFlags = 0;

    if (preferenceFlags & BEAGLE_FLAG_SCALING_AUTO || requirementFlags & BEAGLE_FLAG_SCALING_AUTO) {
        kFlags |= BEAGLE_FLAG_SCALING_AUTO;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_ALWAYS || requirementFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
        kFlags |= BEAGLE_FLAG_SCALING_ALWAYS;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount + 1; // +1 for temp buffer used by edgelikelihood
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_DYNAMIC || requirementFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
        kFlags |= BEAGLE_FLAG_SCALING_DYNAMIC;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALERS_LOG || requirementFlags & BEAGLE_FLAG_SCALERS_LOG) {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
    } else {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    }

    if (requirementFlags & BEAGLE_FLAG_EIGEN_COMPLEX || preferenceFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        kFlags |= BEAGLE_FLAG_EIGEN_COMPLEX;
    else
        kFlags |= BEAGLE_FLAG_EIGEN_REAL;

    if (requirementFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED || preferenceFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED)
        kFlags |= BEAGLE_FLAG_INVEVEC_TRANSPOSED;
    else
        kFlags |= BEAGLE_FLAG_INVEVEC_STANDARD;

    if (requirementFlags & BEAGLE_FLAG_THREADING_CPP || preferenceFlags & BEAGLE_FLAG_THREADING_CPP)
        kFlags |= BEAGLE_FLAG_THREADING_CPP;
    else
        kFlags |= BEAGLE_FLAG_THREADING_NONE;

    if (kFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        gEigenDecomposition = new EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount,kCategoryCount,kFlags);
    else
        gEigenDecomposition = new EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount, kCategoryCount,kFlags);

    gCategoryRates = (double**) calloc(sizeof(double), kEigenDecompCount);
    if (gCategoryRates == NULL)
        throw std::bad_alloc();

    gPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);
    if (gPatternWeights == NULL)
        throw std::bad_alloc();

    // TODO: if pattern padding is implemented this will create problems with setTipPartials
    kPartialsSize = kPaddedPatternCount * kPartialsPaddedStateCount * kCategoryCount;

    gPartials = (REALTYPE**) malloc(sizeof(REALTYPE*) * kBufferCount);
    if (gPartials == NULL)
     throw std::bad_alloc();

    gStateFrequencies = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gStateFrequencies == NULL)
        throw std::bad_alloc();

    gCategoryWeights = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gCategoryWeights == NULL)
        throw std::bad_alloc();

    // assigning kBufferCount to this array so that we can just check if a tipStateBuffer is
    // allocated
    gTipStates = (int**) malloc(sizeof(int*) * kBufferCount);
    if (gTipStates == NULL)
        throw std::bad_alloc();

    for (int i = 0; i < kBufferCount; i++) {
        gPartials[i] = NULL;
        gTipStates[i] = NULL;
    }

    for (int i = kTipCount; i < kBufferCount; i++) {
        gPartials[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[i] == NULL)
            throw std::bad_alloc();
    }

    gScaleBuffers = NULL;

    gAutoScaleBuffers = NULL;

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        gAutoScaleBuffers = (signed short**) malloc(sizeof(signed short*) * kScaleBufferCount);
        if (gAutoScaleBuffers == NULL)
            throw std::bad_alloc();
        for (int i = 0; i < kScaleBufferCount; i++) {
            gAutoScaleBuffers[i] = (signed short*) malloc(sizeof(signed short) * scaleBufferSize);
            if (gAutoScaleBuffers[i] == 0L)
                throw std::bad_alloc();
        }
        gActiveScalingFactors = (int*) malloc(sizeof(int) * kInternalPartialsBufferCount);
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*));
        gScaleBuffers[0] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);
    } else {
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*) * kScaleBufferCount);
        if (gScaleBuffers == NULL)
            throw std::bad_alloc();

        for (int i = 0; i < kScaleBufferCount; i++) {
            gScaleBuffers[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);

            if (gScaleBuffers[i] == 0L)
                throw std::bad_alloc();


            if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
                for (int j=0; j < scaleBufferSize; j++) {
                    gScaleBuffers[i][j] = 1.0;
                }
            }
        }
    }


    gTransitionMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kMatrixCount);
    if (gTransitionMatrices == NULL)
        throw std::bad_alloc();
    for (int i = 0; i < kMatrixCount; i++) {
        gTransitionMatrices[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kMatrixSize * kCategoryCount);
        if (gTransitionMatrices[i] == 0L)
            throw std::bad_alloc();
    }

    integrationTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

//    cLikelihoodTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kCategoryCount);
    grandDenominatorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount); // TODO Deprecate in favor of integrationTmp
    grandNumeratorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount);
    crossProductNumeratorTmp = nullptr;
//    grandNumeratorLowerBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);
//    grandNumeratorUpperBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);

    outLogLikelihoodsTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outFirstDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outSecondDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

    zeros = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    ones = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    for(int i = 0; i < kPaddedPatternCount; i++) {
        zeros[i] = 0.0;
        ones[i] = 1.0;
    }

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            } else if (kPatternCount < BEAGLE_CPU_ASYNC_LIMIT_PATTERN_COUNT) {
                hardwareThreads = BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > hardwareThreads/2) {
                partitionCount = hardwareThreads/2;
            }
            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = false; //TODO: XJ: need to change this back to true
            }
            // TODO: XJ: need to change below back to true
            kAutoPartitioningEnabled = false;
        }
    }

    return BEAGLE_SUCCESS;
}